

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O0

bool __thiscall cmCTestHG::LoadModifications(cmCTestHG *this)

{
  undefined1 local_190 [8];
  OutputLogger err;
  StatusParser out;
  char *hg_status [3];
  char *hg;
  cmCTestHG *this_local;
  
  out.RegexStatus.searchstring = (char *)std::__cxx11::string::c_str();
  StatusParser::StatusParser((StatusParser *)&err.super_LineParser.Separator,this,"status-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_190,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "status-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,&out.RegexStatus.searchstring,
                      (OutputParser *)&err.super_LineParser.Separator,(OutputParser *)local_190,
                      (char *)0x0,Auto);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_190);
  StatusParser::~StatusParser((StatusParser *)&err.super_LineParser.Separator);
  return true;
}

Assistant:

bool cmCTestHG::LoadModifications()
{
  // Use 'hg status' to get modified files.
  const char* hg = this->CommandLineTool.c_str();
  const char* hg_status[] = { hg, "status", CM_NULLPTR };
  StatusParser out(this, "status-out> ");
  OutputLogger err(this->Log, "status-err> ");
  this->RunChild(hg_status, &out, &err);
  return true;
}